

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::VariableDatum::SetDatumValue(VariableDatum *this,KOCTET *data,KUINT32 sizeInBits)

{
  ulong uVar1;
  pointer pDVar2;
  KUINT16 j;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  DatumEntry de;
  value_type local_40;
  VariableDatum *local_38;
  
  pDVar2 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_v8DatumValue).
      super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->m_v8DatumValue).
    super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  local_38 = this;
  dVar5 = ceil((double)sizeInBits * 0.125);
  uVar4 = 0;
  while( true ) {
    if ((uint)(long)dVar5 <= (uint)(uVar4 & 0xffff)) break;
    local_40.Buffer[0] = '\0';
    local_40.Buffer[1] = '\0';
    local_40.Buffer[2] = '\0';
    local_40.Buffer[3] = '\0';
    local_40.Buffer[4] = '\0';
    local_40.Buffer[5] = '\0';
    local_40.Buffer[6] = '\0';
    local_40.Buffer[7] = '\0';
    for (uVar3 = 0;
        (uVar3 < 8 && (uVar1 = (uVar4 & 0xffff) + uVar3, ((uint)uVar1 & 0xffff) < (uint)(long)dVar5)
        ); uVar3 = uVar3 + 1) {
      local_40.Buffer[uVar3] = data[uVar1 & 0xffff];
    }
    std::
    vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ::push_back(&this->m_v8DatumValue,&local_40);
    uVar4 = (ulong)(uint)((int)uVar3 + (int)uVar4);
  }
  local_38->m_ui32DatumLength = sizeInBits;
  return;
}

Assistant:

void VariableDatum::SetDatumValue( const KOCTET * data, KUINT32 sizeInBits )
{
    m_v8DatumValue.clear();

    KUINT32 sizeInOctets = ceil( sizeInBits / 8.0 );
    for( KUINT16 i = 0; i < sizeInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; j < 8 && i < sizeInOctets; ++j, ++i )
        {
            de.Buffer[j] = data[i];
        }
        m_v8DatumValue.push_back( de );
    }

    m_ui32DatumLength = sizeInBits;
}